

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::StyledWriter::writeCommentAfterValueOnSameLine(StyledWriter *this,Value *root)

{
  bool bVar1;
  string local_c8;
  string local_a8;
  string local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Value *local_18;
  Value *root_local;
  StyledWriter *this_local;
  
  local_18 = root;
  root_local = (Value *)this;
  bVar1 = Value::hasComment(root,commentAfterOnSameLine);
  if (bVar1) {
    Value::getComment_abi_cxx11_(&local_78,local_18,commentAfterOnSameLine);
    normalizeEOL(&local_58,&local_78);
    std::operator+(&local_38," ",&local_58);
    std::__cxx11::string::operator+=((string *)&this->document_,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  bVar1 = Value::hasComment(local_18,commentAfter);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)&this->document_,"\n");
    Value::getComment_abi_cxx11_(&local_c8,local_18,commentAfter);
    normalizeEOL(&local_a8,&local_c8);
    std::__cxx11::string::operator+=((string *)&this->document_,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::operator+=((string *)&this->document_,"\n");
  }
  return;
}

Assistant:

void StyledWriter::writeCommentAfterValueOnSameLine(const Value& root) {
  if (root.hasComment(commentAfterOnSameLine))
    document_ += " " + normalizeEOL(root.getComment(commentAfterOnSameLine));

  if (root.hasComment(commentAfter)) {
    document_ += "\n";
    document_ += normalizeEOL(root.getComment(commentAfter));
    document_ += "\n";
  }
}